

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellReissner4::InterpolateOrientation(ChElementShellReissner4 *this)

{
  ChVector<double> *v;
  ChMatrix33<double> *pCVar1;
  ChMatrix33<double> (*paCVar2) [4];
  long lVar3;
  ChVector<double> *phi;
  int i;
  long lVar4;
  ChVector<double> phi_tilde_0;
  ChMatrix33<double> T_overline_Gamma_tilde_i;
  ChMatrix33<double> Gammai;
  ChMatrix33<double> Ri;
  ChMatrix33<double> DRot_I_phi_tilde_n_MT_T_overline [4];
  Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> local_260;
  ChVector<double> local_250;
  Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
  local_238 [3];
  ChMatrix33<double> local_1e8;
  ChMatrix33<double> local_1a0;
  ChMatrix33<double> local_158 [4];
  
  v = this->phi_tilde_n;
  pCVar1 = &this->T_overline;
  phi = v;
  for (lVar4 = 0; lVar4 != 0x120; lVar4 = lVar4 + 0x48) {
    rotutils::DRot_I(&local_1a0,phi);
    local_1e8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&local_1a0;
    local_1e8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)pCVar1;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,0>>
              ((Matrix<double,_3,_3,_1,_3,_3> *)
               ((long)local_158[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + lVar4),
               (Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>
                *)&local_1e8);
    phi = phi + 1;
  }
  paCVar2 = this->Phi_Delta_i;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    Interp(v,(double *)(&xi_i + lVar4 * 2));
    this->phi_tilde_i[lVar4].m_data[0] = (double)local_238[0].m_lhs.m_lhs;
    this->phi_tilde_i[lVar4].m_data[1] = (double)local_238[0].m_lhs.m_rhs;
    this->phi_tilde_i[lVar4].m_data[2] = (double)local_238[0].m_rhs;
    rotutils::RotAndDRot(this->phi_tilde_i + lVar4,&local_1a0,&local_1e8);
    local_238[0].m_lhs.m_rhs = &local_1a0.super_Matrix<double,_3,_3,_1,_3,_3>;
    local_238[0].m_rhs = &this->iTa_i[lVar4].super_Matrix<double,_3,_3,_1,_3,_3>;
    local_238[0].m_lhs.m_lhs = &pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&this->T_i[lVar4].super_Matrix<double,_3,_3,_1,_3,_3>,local_238);
    local_250.m_data[1] = (double)&local_1e8;
    local_250.m_data[0] = (double)pCVar1;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)local_238,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_250);
    for (lVar3 = 0; lVar3 != 0x120; lVar3 = lVar3 + 0x48) {
      local_250.m_data[1] =
           (double)((long)local_158[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + lVar3);
      local_250.m_data[0] = (double)local_238;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)
                 ((long)(*paCVar2)[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + lVar3),
                 (Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                  *)&local_250);
    }
    paCVar2 = paCVar2 + 1;
  }
  Interp(v,(double *)xi_0);
  rotutils::Rot((ChMatrix33<double> *)local_238,&local_250);
  local_260.m_lhs = &pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>;
  local_260.m_rhs = (RhsNested)local_238;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&(this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>,&local_260);
  paCVar2 = this->Phi_Delta_A;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    Interp(v,(double *)(xi_A + lVar4 * 0x10));
    this->phi_tilde_A[lVar4].m_data[0] = (double)local_238[0].m_lhs.m_lhs;
    this->phi_tilde_A[lVar4].m_data[1] = (double)local_238[0].m_lhs.m_rhs;
    this->phi_tilde_A[lVar4].m_data[2] = (double)local_238[0].m_rhs;
    rotutils::RotAndDRot(this->phi_tilde_A + lVar4,&local_1a0,&local_1e8);
    local_238[0].m_rhs = &this->iTa_A[lVar4].super_Matrix<double,_3,_3,_1,_3,_3>;
    local_238[0].m_lhs.m_lhs = &pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>;
    local_238[0].m_lhs.m_rhs = &local_1a0.super_Matrix<double,_3,_3,_1,_3,_3>;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&this->T_A[lVar4].super_Matrix<double,_3,_3,_1,_3,_3>,local_238);
    local_260.m_rhs = &local_1e8.super_Matrix<double,_3,_3,_1,_3,_3>;
    local_260.m_lhs = &pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)local_238,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_260);
    for (lVar3 = 0; lVar3 != 0x120; lVar3 = lVar3 + 0x48) {
      local_260.m_rhs =
           (RhsNested)
           ((long)local_158[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + lVar3);
      local_260.m_lhs = (LhsNested)local_238;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)
                 ((long)(*paCVar2)[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + lVar3),&local_260);
    }
    paCVar2 = paCVar2 + 1;
  }
  return;
}

Assistant:

void ChElementShellReissner4::InterpolateOrientation() {
    ChMatrix33<> DRot_I_phi_tilde_n_MT_T_overline[NUMNODES];
    ChMatrix33<> Ri, Gammai;
    for (int n = 0; n < NUMNODES; n++) {
        ChMatrix33<> mDrot_I = rotutils::DRot_I(phi_tilde_n[n]);
#ifdef CHSIMPLIFY_DROT
        mDrot_I = ChMatrix33<>(1);
#endif
        DRot_I_phi_tilde_n_MT_T_overline[n] = mDrot_I * T_overline.transpose();
    }
    for (int i = 0; i < NUMIP; i++) {
        phi_tilde_i[i] = Interp(phi_tilde_n, xi_i[i]);
        rotutils::RotAndDRot(phi_tilde_i[i], Ri, Gammai);
#ifdef CHSIMPLIFY_DROT
        Gammai = ChMatrix33<>(1);
#endif
        T_i[i] = T_overline * Ri * iTa_i[i];
        ChMatrix33<> T_overline_Gamma_tilde_i(T_overline * Gammai);
        for (int n = 0; n < NUMNODES; n++) {
            Phi_Delta_i[i][n] = T_overline_Gamma_tilde_i * DRot_I_phi_tilde_n_MT_T_overline[n];
        }
    }
    ChVector<> phi_tilde_0 = Interp(phi_tilde_n, xi_0);
    T_0 = T_overline * rotutils::Rot(phi_tilde_0);
    for (int i = 0; i < NUMSSEP; i++) {
        phi_tilde_A[i] = Interp(phi_tilde_n, xi_A[i]);
        rotutils::RotAndDRot(phi_tilde_A[i], Ri, Gammai);
#ifdef CHSIMPLIFY_DROT
        Gammai = ChMatrix33<>(1);
#endif
        T_A[i] = T_overline * Ri * iTa_A[i];
        ChMatrix33<> T_overline_Gamma_tilde_A(T_overline * Gammai);
        for (int n = 0; n < NUMNODES; n++) {
            Phi_Delta_A[i][n] = T_overline_Gamma_tilde_A * DRot_I_phi_tilde_n_MT_T_overline[n];
        }
    }
}